

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

AnonymousProgramSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AnonymousProgramSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,SyntaxList<slang::syntax::MemberSyntax> *args_3,Token *args_4)

{
  Token keyword;
  Token semi;
  Token endkeyword;
  AnonymousProgramSyntax *this_00;
  
  this_00 = (AnonymousProgramSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AnonymousProgramSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (AnonymousProgramSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  semi.kind = args_2->kind;
  semi._2_1_ = args_2->field_0x2;
  semi.numFlags.raw = (args_2->numFlags).raw;
  semi.rawLen = args_2->rawLen;
  semi.info = args_2->info;
  endkeyword.kind = args_4->kind;
  endkeyword._2_1_ = args_4->field_0x2;
  endkeyword.numFlags.raw = (args_4->numFlags).raw;
  endkeyword.rawLen = args_4->rawLen;
  endkeyword.info = args_4->info;
  slang::syntax::AnonymousProgramSyntax::AnonymousProgramSyntax
            (this_00,args,keyword,semi,args_3,endkeyword);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }